

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O3

int coda_pcre2_substring_get_bynumber_8
              (pcre2_match_data_8 *match_data,uint32_t stringnumber,PCRE2_UCHAR8 **stringptr,
              size_t *sizeptr)

{
  size_t sVar1;
  int iVar2;
  size_t in_RAX;
  void *pvVar3;
  size_t size;
  size_t local_38;
  
  local_38 = in_RAX;
  iVar2 = coda_pcre2_substring_length_bynumber_8(match_data,stringnumber,&local_38);
  if (-1 < iVar2) {
    pvVar3 = coda__pcre2_memctl_malloc_8(local_38 * 8 + 0x20,&match_data->memctl);
    sVar1 = local_38;
    if (pvVar3 == (void *)0x0) {
      iVar2 = -0x30;
    }
    else {
      memcpy((PCRE2_UCHAR8 *)((long)pvVar3 + 0x18),
             match_data->subject + match_data->ovector[stringnumber * 2],local_38);
      *(undefined1 *)((long)pvVar3 + sVar1 + 0x18) = 0;
      *stringptr = (PCRE2_UCHAR8 *)((long)pvVar3 + 0x18);
      *sizeptr = local_38;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_get_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_UCHAR **stringptr, PCRE2_SIZE *sizeptr)
{
int rc;
PCRE2_SIZE size;
PCRE2_UCHAR *yield;
rc = pcre2_substring_length_bynumber(match_data, stringnumber, &size);
if (rc < 0) return rc;
yield = PRIV(memctl_malloc)(sizeof(pcre2_memctl) +
  (size + 1)*PCRE2_CODE_UNIT_WIDTH, (pcre2_memctl *)match_data);
if (yield == NULL) return PCRE2_ERROR_NOMEMORY;
yield = (PCRE2_UCHAR *)(((char *)yield) + sizeof(pcre2_memctl));
memcpy(yield, match_data->subject + match_data->ovector[stringnumber*2],
  CU2BYTES(size));
yield[size] = 0;
*stringptr = yield;
*sizeptr = size;
return 0;
}